

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code
createUniqueEntity(Twine *Model,int *ResultFD,SmallVectorImpl<char> *ResultPath,bool MakeAbsolute,
                  uint Mode,FSEntity Type,OpenFlags Flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  error_category *peVar4;
  error_category *peVar5;
  undefined7 in_register_00000009;
  error_category *extraout_RDX;
  ulong uVar6;
  error_code eVar7;
  SmallString<128U> ModelStorage;
  SmallString<128U> TDir;
  Twine local_1b0;
  Twine local_198;
  SmallVectorImpl<char> local_180;
  undefined1 local_170 [128];
  Twine local_f0;
  Twine local_d8;
  Child local_c0;
  undefined8 local_b8;
  Twine local_b0 [5];
  
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_170;
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_180.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  llvm::Twine::toVector(Model,&local_180);
  if ((int)CONCAT71(in_register_00000009,MakeAbsolute) != 0) {
    llvm::Twine::Twine((Twine *)&local_c0,&local_180);
    bVar1 = llvm::sys::path::is_absolute((Twine *)&local_c0,native);
    if (!bVar1) {
      local_c0.twine = local_b0;
      local_b8 = 0x8000000000;
      llvm::sys::path::system_temp_directory(true,(SmallVectorImpl<char> *)&local_c0);
      llvm::Twine::Twine(&local_198,&local_180);
      llvm::Twine::Twine(&local_1b0,"");
      llvm::Twine::Twine(&local_d8,"");
      llvm::Twine::Twine(&local_f0,"");
      llvm::sys::path::append
                ((SmallVectorImpl<char> *)&local_c0,native,&local_198,&local_1b0,&local_d8,&local_f0
                );
      llvm::SmallVectorImpl<char>::swap(&local_180,(SmallVectorImpl<char> *)&local_c0);
      if (local_c0.twine != local_b0) {
        free(local_c0.twine);
      }
    }
  }
  llvm::SmallVectorImpl<char>::operator=(ResultPath,&local_180);
  local_c0.twine = local_c0.twine & 0xffffffffffffff00;
  llvm::SmallVectorTemplateBase<char,_true>::push_back
            (&ResultPath->super_SmallVectorTemplateBase<char,_true>,&local_c0.character);
  uVar3 = (ulong)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - 1;
  if ((ResultPath->super_SmallVectorTemplateBase<char,_true>).
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3) {
    __assert_fail("Size <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  (ResultPath->super_SmallVectorTemplateBase<char,_true>).
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = (uint)uVar3;
LAB_00158e37:
  do {
    uVar3 = local_180.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        if ((local_180.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff)
            <= uVar6) {
LAB_00158f69:
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        if (*(char *)((long)local_180.super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                     + uVar6) == '%') {
          uVar2 = llvm::sys::Process::GetRandomNumber();
          if ((ResultPath->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar6)
          goto LAB_00158f69;
          *(char *)((long)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   uVar6) = "0123456789abcdef"[uVar2 & 0xf];
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    if (Type != FS_Dir) {
      if (Type == FS_File) {
        llvm::Twine::Twine((Twine *)&local_c0,
                           (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX);
        eVar7 = llvm::sys::fs::openFile
                          ((Twine *)&local_c0,ResultFD,CD_CreateNew,FA_Write|FA_Read,Flags,Mode);
        goto LAB_00158ed6;
      }
      llvm::Twine::Twine((Twine *)&local_c0,
                         (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX);
      uVar2 = llvm::sys::fs::access(&local_c0.character,0);
      uVar3 = (ulong)uVar2;
      peVar5 = (error_category *)std::_V2::generic_category();
      if (extraout_RDX == peVar5 && uVar2 == 2) {
LAB_00158f32:
        uVar3 = 0;
        peVar5 = (error_category *)std::_V2::system_category();
        goto LAB_00158f3d;
      }
      peVar5 = extraout_RDX;
      if (uVar2 != 0) {
LAB_00158f3d:
        if ((undefined1 *)
            local_180.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_170) {
          free(local_180.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
        }
        eVar7._M_cat = peVar5;
        eVar7._0_8_ = uVar3;
        return eVar7;
      }
      goto LAB_00158e37;
    }
    llvm::Twine::Twine((Twine *)&local_c0,
                       (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX);
    eVar7 = llvm::sys::fs::create_directory((Twine *)&local_c0,false,owner_all|group_all);
LAB_00158ed6:
    peVar5 = eVar7._M_cat;
    uVar2 = eVar7._M_value;
    if (uVar2 == 0) goto LAB_00158f32;
    uVar3 = (ulong)uVar2;
    peVar4 = (error_category *)std::_V2::generic_category();
    if ((uVar2 != 0x11) || (peVar5 != peVar4)) goto LAB_00158f3d;
  } while( true );
}

Assistant:

static std::error_code
createUniqueEntity(const Twine &Model, int &ResultFD,
                   SmallVectorImpl<char> &ResultPath, bool MakeAbsolute,
                   unsigned Mode, FSEntity Type,
                   sys::fs::OpenFlags Flags = sys::fs::OF_None) {
  SmallString<128> ModelStorage;
  Model.toVector(ModelStorage);

  if (MakeAbsolute) {
    // Make model absolute by prepending a temp directory if it's not already.
    if (!sys::path::is_absolute(Twine(ModelStorage))) {
      SmallString<128> TDir;
      sys::path::system_temp_directory(true, TDir);
      sys::path::append(TDir, Twine(ModelStorage));
      ModelStorage.swap(TDir);
    }
  }

  // From here on, DO NOT modify model. It may be needed if the randomly chosen
  // path already exists.
  ResultPath = ModelStorage;
  // Null terminate.
  ResultPath.push_back(0);
  ResultPath.pop_back();

retry_random_path:
  // Replace '%' with random chars.
  for (unsigned i = 0, e = ModelStorage.size(); i != e; ++i) {
    if (ModelStorage[i] == '%')
      ResultPath[i] = "0123456789abcdef"[sys::Process::GetRandomNumber() & 15];
  }

  // Try to open + create the file.
  switch (Type) {
  case FS_File: {
    if (std::error_code EC =
            sys::fs::openFileForReadWrite(Twine(ResultPath.begin()), ResultFD,
                                          sys::fs::CD_CreateNew, Flags, Mode)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }

    return std::error_code();
  }

  case FS_Name: {
    std::error_code EC =
        sys::fs::access(ResultPath.begin(), sys::fs::AccessMode::Exist);
    if (EC == errc::no_such_file_or_directory)
      return std::error_code();
    if (EC)
      return EC;
    goto retry_random_path;
  }

  case FS_Dir: {
    if (std::error_code EC =
            sys::fs::create_directory(ResultPath.begin(), false)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }
    return std::error_code();
  }
  }
  llvm_unreachable("Invalid Type");
}